

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void __thiscall Assimp::FBX::Node::AddChild<long>(Node *this,string *name,long more)

{
  undefined1 local_90 [8];
  Node c;
  long more_local;
  string *name_local;
  Node *this_local;
  
  c.property_start = more;
  Node((Node *)local_90,name);
  AddProperties<long>((Node *)local_90,c.property_start);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,(value_type *)local_90);
  ~Node((Node *)local_90);
  return;
}

Assistant:

void AddChild(
        const std::string& name,
        More... more
    ) {
        FBX::Node c(name);
        c.AddProperties(more...);
        children.push_back(c);
    }